

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.cc
# Opt level: O3

void __thiscall AGC::work(AGC *this,size_t nsamples,complex<float> *ci,complex<float> *co)

{
  float fVar1;
  ulong uVar2;
  float fVar3;
  
  if (nsamples != 0) {
    fVar1 = this->gain_;
    uVar2 = 0;
    do {
      fVar3 = fVar1 * (float)ci[uVar2]._M_value;
      co[uVar2]._M_value = CONCAT44(fVar1 * (float)(ci[uVar2]._M_value >> 0x20),fVar3);
      co[uVar2 + 1]._M_value =
           CONCAT44(this->gain_ * (float)(ci[uVar2 + 1]._M_value >> 0x20),
                    this->gain_ * (float)ci[uVar2 + 1]._M_value);
      co[uVar2 + 2]._M_value =
           CONCAT44(this->gain_ * (float)(ci[uVar2 + 2]._M_value >> 0x20),
                    this->gain_ * (float)ci[uVar2 + 2]._M_value);
      co[uVar2 + 3]._M_value =
           CONCAT44(this->gain_ * (float)(ci[uVar2 + 3]._M_value >> 0x20),
                    this->gain_ * (float)ci[uVar2 + 3]._M_value);
      fVar1 = this->alpha_;
      fVar3 = cabsf(fVar3);
      fVar1 = this->gain_ + (0.5 - fVar3) * fVar1;
      fVar3 = this->min_;
      if (this->min_ <= fVar1) {
        fVar3 = fVar1;
      }
      fVar1 = this->max_;
      if (fVar3 <= this->max_) {
        fVar1 = fVar3;
      }
      this->gain_ = fVar1;
      uVar2 = uVar2 + 4;
    } while (uVar2 < nsamples);
  }
  return;
}

Assistant:

void AGC::work(
    size_t nsamples,
    std::complex<float>* ci,
    std::complex<float>* co) {
  // Process 4 samples at a time.
  for (size_t i = 0; i < nsamples; i += 4) {
    // Apply gain
    co[i+0] = ci[i+0] * gain_;
    co[i+1] = ci[i+1] * gain_;
    co[i+2] = ci[i+2] * gain_;
    co[i+3] = ci[i+3] * gain_;

    // Update gain.
    // Use only the first sample and ignore the others.
    gain_ += alpha_ * (0.5 - abs(co[i]));
    gain_ = std::max(gain_, min_);
    gain_ = std::min(gain_, max_);
  }
}